

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commonutils.cpp
# Opt level: O3

ModelPtr owningModel(ParentedEntityConstPtr *entity)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  element_type *peVar1;
  Model *__tmp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  Component *__tmp_1;
  ComponentPtr CVar4;
  ModelPtr MVar5;
  ComponentPtr component;
  ParentedEntityConstPtr local_60;
  ParentedEntityConstPtr local_50;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  libcellml::ParentedEntity::parent();
  if ((local_60.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr == (element_type *)0x0) ||
     (peVar1 = (element_type *)
               __dynamic_cast(local_60.
                              super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,&libcellml::ParentedEntity::typeinfo,
                              &libcellml::Model::typeinfo), peVar1 == (element_type *)0x0)) {
    (entity->super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
         = (element_type *)0x0;
    (entity->super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    (entity->super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
         = peVar1;
    (entity->super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi =
         local_60.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_60.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_60.
                 super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi + 8) =
             *(int *)(local_60.
                      super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_60.
                 super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi + 8) =
             *(int *)(local_60.
                      super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi + 8) + 1;
      }
    }
  }
  if (local_60.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.
               super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  CVar4 = owningComponent(&local_60);
  _Var2 = CVar4.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if ((entity->super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr == (element_type *)0x0) {
    peVar1 = local_60.
             super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    do {
      if (peVar1 == (element_type *)0x0) break;
      libcellml::ParentedEntity::parent();
      if (local_50.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        peVar1 = (element_type *)0x0;
LAB_00104b8c:
        _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        peVar3 = peVar1;
      }
      else {
        peVar1 = (element_type *)
                 __dynamic_cast(local_50.
                                super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,&libcellml::ParentedEntity::typeinfo,
                                &libcellml::Model::typeinfo,0);
        _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        peVar3 = (element_type *)0x0;
        if (peVar1 != (element_type *)0x0) {
          if (local_50.
              super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
          goto LAB_00104b8c;
          _Var2._M_pi = local_50.
                        super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          peVar3 = peVar1;
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_50.
                     super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 8) =
                 *(int *)(local_50.
                          super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_50.
                     super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 8) =
                 *(int *)(local_50.
                          super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + 8) + 1;
          }
        }
      }
      (entity->super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr = peVar3;
      this = (entity->
             super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
      (entity->super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = _Var2._M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (local_50.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.
                   super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_40 = local_60.
                 super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      local_38 = local_60.
                 super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      if (local_60.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_60.
                   super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi + 8) =
               *(int *)(local_60.
                        super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_60.
                   super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi + 8) =
               *(int *)(local_60.
                        super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi + 8) + 1;
        }
      }
      CVar4 = owningComponent(&local_50);
      peVar1 = local_50.
               super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      this_00._M_pi =
           local_60.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      _Var2 = CVar4.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
      local_60.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_50.
               super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_60.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_50.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
        _Var2._M_pi = extraout_RDX;
      }
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
        _Var2._M_pi = extraout_RDX_00;
      }
    } while ((entity->
             super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             == (element_type *)0x0);
  }
  if (local_60.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.
               super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_01;
  }
  MVar5.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  MVar5.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)entity;
  return (ModelPtr)MVar5.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ModelPtr owningModel(const libcellml::ParentedEntityConstPtr &entity)
{
    auto model = std::dynamic_pointer_cast<libcellml::Model>(entity->parent());
    auto component = owningComponent(entity);
    while ((model == nullptr) && (component != nullptr)) {
        model = std::dynamic_pointer_cast<libcellml::Model>(component->parent());
        component = owningComponent(component);
    }

    return model;
}